

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executable.cpp
# Opt level: O1

addr_type __thiscall Executable::detectAddrType(Executable *this,offset_t offset,addr_type hintType)

{
  addr_type aVar1;
  addr_type aVar2;
  int iVar3;
  
  if (hintType == RAW) {
    aVar2 = (*(this->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0x15])(this,offset,1);
    aVar2 = aVar2 & 0xff;
  }
  else {
    aVar2 = RVA;
    if (hintType != NOT_ADDR) {
      aVar2 = hintType;
    }
    iVar3 = (*(this->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0x15])
                      (this,offset,(ulong)aVar2);
    aVar1 = aVar2 == RVA | RVA;
    if ((char)iVar3 != '\0') {
      aVar1 = aVar2;
    }
    iVar3 = (*(this->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0x15])
                      (this,offset,(ulong)aVar1);
    aVar2 = NOT_ADDR;
    if ((char)iVar3 != '\0') {
      aVar2 = aVar1;
    }
  }
  return aVar2;
}

Assistant:

Executable::addr_type Executable::detectAddrType(offset_t offset, Executable::addr_type hintType)
{
    if (hintType == Executable::RAW) {
        if (this->isValidAddr(offset, hintType) == false) {
            return Executable::NOT_ADDR;
        } else return hintType; // it is RAW
    }

    if (hintType == Executable::NOT_ADDR) {
        hintType = Executable::RVA; // check RVA by default
    }
    if (this->isValidAddr(offset, hintType) == false) {
        if (hintType == Executable::RVA) {
            hintType = Executable::VA; // if not RVA, try VA
        } else {
            hintType = Executable::RVA; // if not VA, try RVA
        }
    }
    if (this->isValidAddr(offset, hintType) == false) {
        return Executable::NOT_ADDR; //every attempt failed! it's invalid!
    }
    return hintType;
}